

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

Matrix * Matrix::mul(Matrix *__return_storage_ptr__,Matrix *mat,double coef)

{
  pointer pvVar1;
  double *pdVar2;
  vector<double,_std::allocator<double>_> *vec;
  pointer pvVar3;
  double *val;
  double *pdVar4;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *__range1;
  
  Matrix(__return_storage_ptr__,mat);
  pvVar1 = (__return_storage_ptr__->m_vals).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar3 = (__return_storage_ptr__->m_vals).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pvVar3 != pvVar1; pvVar3 = pvVar3 + 1) {
    pdVar2 = (pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pdVar4 = (pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start; pdVar4 != pdVar2; pdVar4 = pdVar4 + 1) {
      *pdVar4 = *pdVar4 * coef;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix Matrix::mul(const Matrix& mat, double coef){
    Matrix result=mat;
    
    for(auto& vec: result.m_vals){
        for(auto& val: vec){
            val*=coef;
        }
    }
    
    return result;
}